

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  sqlite3 *psVar4;
  size_t sVar5;
  char *pcVar6;
  undefined1 local_118 [8];
  DateTime y_1;
  char c;
  i64 iS;
  undefined1 auStack_d0 [4];
  int h;
  DateTime y;
  double s;
  undefined1 local_90 [7];
  char cf;
  sqlite3_str sRes;
  char *zFmt;
  sqlite3 *db;
  size_t j;
  size_t i;
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  if (((argc != 0) &&
      (x._40_8_ = argv, sRes._24_8_ = sqlite3_value_text(*argv),
      (uchar *)sRes._24_8_ != (uchar *)0x0)) &&
     (iVar2 = isDate(context,argc + -1,(sqlite3_value **)(x._40_8_ + 8),(DateTime *)&i), iVar2 == 0)
     ) {
    psVar4 = sqlite3_context_db_handle(context);
    sqlite3StrAccumInit((StrAccum *)local_90,(sqlite3 *)0x0,(char *)0x0,0,psVar4->aLimit[0]);
    computeJD((DateTime *)&i);
    computeYMD_HMS((DateTime *)&i);
    db = (sqlite3 *)0x0;
    j = 0;
    while( true ) {
      if (*(char *)(sRes._24_8_ + j) == '\0') break;
      if (*(char *)(sRes._24_8_ + j) == '%') {
        if (db < j) {
          sqlite3_str_append((sqlite3_str *)local_90,(char *)((long)&db->pVfs + sRes._24_8_),
                             (int)j - (int)db);
        }
        sVar5 = j + 1;
        db = (sqlite3 *)(j + 2);
        cVar1 = *(char *)(sRes._24_8_ + sVar5);
        j = sVar5;
        switch(cVar1) {
        case '%':
          sqlite3_str_appendchar((sqlite3_str *)local_90,1,'%');
          break;
        default:
          sqlite3_str_reset((StrAccum *)local_90);
          return;
        case 'F':
          sqlite3_str_appendf((StrAccum *)local_90,"%04d-%02d-%02d",(ulong)(uint)x.iJD,
                              (ulong)x.iJD._4_4_,(ulong)(uint)x.Y);
          break;
        case 'G':
        case 'g':
          memcpy(auStack_d0,&i,0x30);
          iVar2 = daysAfterMonday((DateTime *)&i);
          _auStack_d0 = (3 - iVar2) * 86400000 + _auStack_d0;
          y.s._1_1_ = 0;
          computeYMD((DateTime *)auStack_d0);
          if (cVar1 == 'g') {
            sqlite3_str_appendf((StrAccum *)local_90,"%02d",
                                (long)(int)(uint)y.iJD % 100 & 0xffffffff);
          }
          else {
            sqlite3_str_appendf((StrAccum *)local_90,"%04d",(ulong)(uint)y.iJD);
          }
          break;
        case 'H':
        case 'k':
          pcVar6 = "%2d";
          if (cVar1 == 'H') {
            pcVar6 = "%02d";
          }
          sqlite3_str_appendf((StrAccum *)local_90,pcVar6,(ulong)(uint)x.M);
          break;
        case 'I':
        case 'l':
          iS._4_4_ = x.M;
          if (0xc < x.M) {
            iS._4_4_ = x.M - 0xc;
          }
          if (iS._4_4_ == 0) {
            iS._4_4_ = 0xc;
          }
          pcVar6 = "%2d";
          if (cVar1 == 'I') {
            pcVar6 = "%02d";
          }
          sqlite3_str_appendf((StrAccum *)local_90,pcVar6,(ulong)iS._4_4_);
          break;
        case 'J':
          sqlite3_str_appendf((StrAccum *)local_90,"%.16g",(double)(long)i / 86400000.0);
          break;
        case 'M':
          sqlite3_str_appendf((StrAccum *)local_90,"%02d",(ulong)(uint)x.D);
          break;
        case 'P':
        case 'p':
          if (x.M < 0xc) {
            pcVar6 = "am";
            if (cVar1 == 'p') {
              pcVar6 = "AM";
            }
            sqlite3_str_append((sqlite3_str *)local_90,pcVar6,2);
          }
          else {
            pcVar6 = "pm";
            if (cVar1 == 'p') {
              pcVar6 = "PM";
            }
            sqlite3_str_append((sqlite3_str *)local_90,pcVar6,2);
          }
          break;
        case 'R':
          sqlite3_str_appendf((StrAccum *)local_90,"%02d:%02d",(ulong)(uint)x.M,(ulong)(uint)x.D);
          break;
        case 'S':
          sqlite3_str_appendf((StrAccum *)local_90,"%02d",(ulong)(uint)(int)(double)x._24_8_);
          break;
        case 'T':
          sqlite3_str_appendf((StrAccum *)local_90,"%02d:%02d:%02d",(ulong)(uint)x.M,
                              (ulong)(uint)x.D,(ulong)(uint)(int)(double)x._24_8_);
          break;
        case 'U':
          iVar2 = daysAfterJan01((DateTime *)&i);
          iVar3 = daysAfterSunday((DateTime *)&i);
          sqlite3_str_appendf((StrAccum *)local_90,"%02d",
                              (long)((iVar2 - iVar3) + 7) / 7 & 0xffffffff);
          break;
        case 'V':
          memcpy(local_118,&i,0x30);
          iVar2 = daysAfterMonday((DateTime *)&i);
          local_118 = (undefined1  [8])((long)((3 - iVar2) * 86400000) + (long)local_118);
          y_1.s._1_1_ = 0;
          computeYMD((DateTime *)local_118);
          iVar2 = daysAfterJan01((DateTime *)local_118);
          sqlite3_str_appendf((StrAccum *)local_90,"%02d",(ulong)(iVar2 / 7 + 1));
          break;
        case 'W':
          iVar2 = daysAfterJan01((DateTime *)&i);
          iVar3 = daysAfterMonday((DateTime *)&i);
          sqlite3_str_appendf((StrAccum *)local_90,"%02d",
                              (long)((iVar2 - iVar3) + 7) / 7 & 0xffffffff);
          break;
        case 'Y':
          sqlite3_str_appendf((StrAccum *)local_90,"%04d",(ulong)(uint)x.iJD);
          break;
        case 'd':
        case 'e':
          pcVar6 = "%2d";
          if (cVar1 == 'd') {
            pcVar6 = "%02d";
          }
          sqlite3_str_appendf((StrAccum *)local_90,pcVar6,(ulong)(uint)x.Y);
          break;
        case 'f':
          y._40_8_ = x._24_8_;
          if (59.999 < (double)x._24_8_) {
            y.validJD = '\x1d';
            y.validYMD = 'Z';
            y.validHMS = 'd';
            y.nFloor = ';';
            y._44_4_ = 0x404dffdf;
          }
          sqlite3_str_appendf((StrAccum *)local_90,"%06.3f",y._40_8_);
          break;
        case 'j':
          iVar2 = daysAfterJan01((DateTime *)&i);
          sqlite3_str_appendf((StrAccum *)local_90,"%03d",(ulong)(iVar2 + 1));
          break;
        case 'm':
          sqlite3_str_appendf((StrAccum *)local_90,"%02d",(ulong)x.iJD._4_4_);
          break;
        case 's':
          if ((x.s._4_1_ >> 2 & 1) == 0) {
            sqlite3_str_appendf((StrAccum *)local_90,"%lld",(long)i / 1000 + -0x3118a36940);
          }
          else {
            sqlite3_str_appendf((StrAccum *)local_90,"%.3f",
                                (double)(long)(i - 0xbfc83e532200) / 1000.0);
          }
          break;
        case 'u':
        case 'w':
          iVar2 = daysAfterSunday((DateTime *)&i);
          y_1._47_1_ = (char)iVar2 + '0';
          if ((y_1._47_1_ == '0') && (cVar1 == 'u')) {
            y_1._47_1_ = 0x37;
          }
          sqlite3_str_appendchar((sqlite3_str *)local_90,1,y_1._47_1_);
        }
      }
      j = j + 1;
    }
    if (db < j) {
      sqlite3_str_append((sqlite3_str *)local_90,(char *)((long)&db->pVfs + sRes._24_8_),
                         (int)j - (int)db);
    }
    sqlite3ResultStrAccum(context,(StrAccum *)local_90);
  }
  return;
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  size_t i,j;
  sqlite3 *db;
  const char *zFmt;
  sqlite3_str sRes;


  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);

  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    char cf;
    if( zFmt[i]!='%' ) continue;
    if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
    i++;
    j = i + 1;
    cf = zFmt[i];
    switch( cf ){
      case 'd':  /* Fall thru */
      case 'e': {
        sqlite3_str_appendf(&sRes, cf=='d' ? "%02d" : "%2d", x.D);
        break;
      }
      case 'f': {  /* Fractional seconds.  (Non-standard) */
        double s = x.s;
        if( s>59.999 ) s = 59.999;
        sqlite3_str_appendf(&sRes, "%06.3f", s);
        break;
      }
      case 'F': {
        sqlite3_str_appendf(&sRes, "%04d-%02d-%02d", x.Y, x.M, x.D);
        break;
      }
      case 'G': /* Fall thru */
      case 'g': {
        DateTime y = x;
        assert( y.validJD );
        /* Move y so that it is the Thursday in the same week as x */
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        if( cf=='g' ){
          sqlite3_str_appendf(&sRes, "%02d", y.Y%100);
        }else{
          sqlite3_str_appendf(&sRes, "%04d", y.Y);
        }
        break;
      }
      case 'H':
      case 'k': {
        sqlite3_str_appendf(&sRes, cf=='H' ? "%02d" : "%2d", x.h);
        break;
      }
      case 'I': /* Fall thru */
      case 'l': {
        int h = x.h;
        if( h>12 ) h -= 12;
        if( h==0 ) h = 12;
        sqlite3_str_appendf(&sRes, cf=='I' ? "%02d" : "%2d", h);
        break;
      }
      case 'j': {  /* Day of year.  Jan01==1, Jan02==2, and so forth */
        sqlite3_str_appendf(&sRes,"%03d",daysAfterJan01(&x)+1);
        break;
      }
      case 'J': {  /* Julian day number.  (Non-standard) */
        sqlite3_str_appendf(&sRes,"%.16g",x.iJD/86400000.0);
        break;
      }
      case 'm': {
        sqlite3_str_appendf(&sRes,"%02d",x.M);
        break;
      }
      case 'M': {
        sqlite3_str_appendf(&sRes,"%02d",x.m);
        break;
      }
      case 'p': /* Fall thru */
      case 'P': {
        if( x.h>=12 ){
          sqlite3_str_append(&sRes, cf=='p' ? "PM" : "pm", 2);
        }else{
          sqlite3_str_append(&sRes, cf=='p' ? "AM" : "am", 2);
        }
        break;
      }
      case 'R': {
        sqlite3_str_appendf(&sRes, "%02d:%02d", x.h, x.m);
        break;
      }
      case 's': {
        if( x.useSubsec ){
          sqlite3_str_appendf(&sRes,"%.3f",
                (x.iJD - 21086676*(i64)10000000)/1000.0);
        }else{
          i64 iS = (i64)(x.iJD/1000 - 21086676*(i64)10000);
          sqlite3_str_appendf(&sRes,"%lld",iS);
        }
        break;
      }
      case 'S': {
        sqlite3_str_appendf(&sRes,"%02d",(int)x.s);
        break;
      }
      case 'T': {
        sqlite3_str_appendf(&sRes,"%02d:%02d:%02d", x.h, x.m, (int)x.s);
        break;
      }
      case 'u':    /* Day of week.  1 to 7.  Monday==1, Sunday==7 */
      case 'w': {  /* Day of week.  0 to 6.  Sunday==0, Monday==1 */
        char c = (char)daysAfterSunday(&x) + '0';
        if( c=='0' && cf=='u' ) c = '7';
        sqlite3_str_appendchar(&sRes, 1, c);
        break;
      }
      case 'U': {  /* Week num. 00-53. First Sun of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
              (daysAfterJan01(&x)-daysAfterSunday(&x)+7)/7);
        break;
      }
      case 'V': {  /* Week num. 01-53. First week with a Thur is week 01 */
        DateTime y = x;
        /* Adjust y so that is the Thursday in the same week as x */
        assert( y.validJD );
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        sqlite3_str_appendf(&sRes,"%02d", daysAfterJan01(&y)/7+1);
        break;
      }
      case 'W': {  /* Week num. 00-53. First Mon of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
           (daysAfterJan01(&x)-daysAfterMonday(&x)+7)/7);
        break;
      }
      case 'Y': {
        sqlite3_str_appendf(&sRes,"%04d",x.Y);
        break;
      }
      case '%': {
        sqlite3_str_appendchar(&sRes, 1, '%');
        break;
      }
      default: {
        sqlite3_str_reset(&sRes);
        return;
      }
    }
  }
  if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
  sqlite3ResultStrAccum(context, &sRes);
}